

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  SectionInfo *__p;
  undefined1 local_60 [8];
  ScopedElement e;
  _Alloc_hider local_40 [2];
  
  __p = (this->super_StreamingReporterBase<Catch::XmlReporter>).m_sectionStack.
        super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
        super__Vector_impl_data._M_finish + -1;
  (this->super_StreamingReporterBase<Catch::XmlReporter>).m_sectionStack.
  super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = __p;
  __gnu_cxx::new_allocator<Catch::SectionInfo>::destroy<Catch::SectionInfo>
            ((new_allocator<Catch::SectionInfo> *)
             &(this->super_StreamingReporterBase<Catch::XmlReporter>).m_sectionStack,__p);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + -1;
  if (1 < iVar1) {
    e._8_8_ = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&e.m_fmt,"OverallResults","");
    XmlWriter::scopedElement((XmlWriter *)local_60,(string *)&this->m_xml,(XmlFormatting)&e.m_fmt);
    if ((_Alloc_hider *)e._8_8_ != local_40) {
      operator_delete((void *)e._8_8_,(ulong)(local_40[0]._M_p + 1));
    }
    e._8_8_ = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&e.m_fmt,"successes","");
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_60,(string *)&e.m_fmt,&(sectionStats->assertions).passed);
    if ((_Alloc_hider *)e._8_8_ != local_40) {
      operator_delete((void *)e._8_8_,(ulong)(local_40[0]._M_p + 1));
    }
    e._8_8_ = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&e.m_fmt,"failures","");
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_60,(string *)&e.m_fmt,&(sectionStats->assertions).failed);
    if ((_Alloc_hider *)e._8_8_ != local_40) {
      operator_delete((void *)e._8_8_,(ulong)(local_40[0]._M_p + 1));
    }
    e._8_8_ = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&e.m_fmt,"expectedFailures","");
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_60,(string *)&e.m_fmt,&(sectionStats->assertions).failedButOk);
    if ((_Alloc_hider *)e._8_8_ != local_40) {
      operator_delete((void *)e._8_8_,(ulong)(local_40[0]._M_p + 1));
    }
    iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xb])();
    if (iVar1 == 1) {
      e._8_8_ = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&e.m_fmt,"durationInSeconds","");
      XmlWriter::writeAttribute<double>
                ((XmlWriter *)local_60,(string *)&e.m_fmt,&sectionStats->durationInSeconds);
      if ((_Alloc_hider *)e._8_8_ != local_40) {
        operator_delete((void *)e._8_8_,(ulong)(local_40[0]._M_p + 1));
      }
    }
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_60);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded(SectionStats const& sectionStats) {
        StreamingReporterBase::sectionEnded(sectionStats);
        if (--m_sectionDepth > 0) {
            XmlWriter::ScopedElement e = m_xml.scopedElement("OverallResults");
            e.writeAttribute("successes", sectionStats.assertions.passed);
            e.writeAttribute("failures", sectionStats.assertions.failed);
            e.writeAttribute("expectedFailures", sectionStats.assertions.failedButOk);

            if (m_config->showDurations() == ShowDurations::Always)
                e.writeAttribute("durationInSeconds", sectionStats.durationInSeconds);

            m_xml.endElement();
        }
    }